

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeMinimumRequired.cxx
# Opt level: O0

bool __thiscall
cmCMakeMinimumRequired::EnforceUnknownArguments(cmCMakeMinimumRequired *this,string *version_max)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined8 uVar7;
  ostream *poVar8;
  reference pvVar9;
  string local_1e8;
  ostringstream local_1b8 [8];
  ostringstream e;
  uint current_tweak;
  uint current_patch;
  uint current_minor;
  uint current_major;
  uint max_tweak;
  uint max_patch;
  uint max_minor;
  uint max_major;
  string *version_max_local;
  cmCMakeMinimumRequired *this_local;
  
  _max_minor = version_max;
  version_max_local = (string *)this;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->UnknownArguments);
  if (bVar1) {
    this_local._7_1_ = 1;
  }
  else {
    max_patch = 0;
    max_tweak = 0;
    current_major = 0;
    current_minor = 0;
    uVar7 = std::__cxx11::string::c_str();
    iVar2 = __isoc99_sscanf(uVar7,"%u.%u.%u.%u",&max_patch,&max_tweak,&current_major,&current_minor)
    ;
    if (1 < iVar2) {
      uVar3 = cmVersion::GetMajorVersion();
      uVar4 = cmVersion::GetMinorVersion();
      uVar5 = cmVersion::GetPatchVersion();
      uVar6 = cmVersion::GetTweakVersion();
      if ((((uVar3 < max_patch) || ((uVar3 == max_patch && (uVar4 < max_tweak)))) ||
          ((uVar3 == max_patch && ((uVar4 == max_tweak && (uVar5 < current_major)))))) ||
         ((uVar3 == max_patch &&
          (((uVar4 == max_tweak && (uVar5 == current_major)) && (uVar6 < current_minor)))))) {
        this_local._7_1_ = 1;
        goto LAB_001c6d24;
      }
    }
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar8 = std::operator<<((ostream *)local_1b8,"called with unknown argument \"");
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->UnknownArguments,0);
    poVar8 = std::operator<<(poVar8,(string *)pvVar9);
    std::operator<<(poVar8,"\".");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
LAB_001c6d24:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCMakeMinimumRequired::EnforceUnknownArguments(
  std::string const& version_max)
{
  if (this->UnknownArguments.empty()) {
    return true;
  }

  // Consider the max version if at least two components were given.
  unsigned int max_major = 0;
  unsigned int max_minor = 0;
  unsigned int max_patch = 0;
  unsigned int max_tweak = 0;
  if (sscanf(version_max.c_str(), "%u.%u.%u.%u", &max_major, &max_minor,
             &max_patch, &max_tweak) >= 2) {
    unsigned int current_major = cmVersion::GetMajorVersion();
    unsigned int current_minor = cmVersion::GetMinorVersion();
    unsigned int current_patch = cmVersion::GetPatchVersion();
    unsigned int current_tweak = cmVersion::GetTweakVersion();

    if ((current_major < max_major) ||
        (current_major == max_major && current_minor < max_minor) ||
        (current_major == max_major && current_minor == max_minor &&
         current_patch < max_patch) ||
        (current_major == max_major && current_minor == max_minor &&
         current_patch == max_patch && current_tweak < max_tweak)) {
      // A ...<max> version was given that is larger than the current
      // version of CMake, so tolerate unknown arguments.
      return true;
    }
  }

  std::ostringstream e;
  e << "called with unknown argument \"" << this->UnknownArguments[0] << "\".";
  this->SetError(e.str());
  return false;
}